

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool anon_unknown.dwarf_74f615::cmakeCheckStampFile(string *stampName)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  RenameResult RVar4;
  char *pcVar5;
  ulong uVar6;
  ostream *poVar7;
  string local_690;
  Status local_670;
  undefined1 local_668 [8];
  string err;
  ofstream stamp;
  string stampTemp;
  ostringstream stampTempStream;
  int local_2ac;
  undefined1 local_2a8 [4];
  int result;
  string dep;
  cmFileTimeCache ftc;
  undefined1 local_240 [8];
  ifstream fin;
  undefined1 local_38 [8];
  string stampDepends;
  string *stampName_local;
  
  stampDepends.field_2._8_8_ = stampName;
  cmStrCat<std::__cxx11::string_const&,char_const(&)[8]>
            ((string *)local_38,stampName,(char (*) [8])".depend");
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_240,pcVar5,_S_in);
  bVar1 = std::ios::operator!((ios *)(local_240 + (long)*(_func_int **)((long)local_240 + -0x18)));
  if ((bVar1 & 1) == 0) {
    cmFileTimeCache::cmFileTimeCache((cmFileTimeCache *)((long)&dep.field_2 + 8));
    std::__cxx11::string::string((string *)local_2a8);
    do {
      bVar2 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)local_240,(string *)local_2a8,(bool *)0x0,0xffffffffffffffff);
      if (!bVar2) {
        bVar2 = false;
        goto LAB_004ea2b0;
      }
      uVar6 = std::__cxx11::string::empty();
    } while ((((uVar6 & 1) != 0) ||
             (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_2a8), *pcVar5 == '#'))
            || ((bVar2 = cmFileTimeCache::Compare
                                   ((cmFileTimeCache *)((long)&dep.field_2 + 8),(string *)local_38,
                                    (string *)local_2a8,&local_2ac), bVar2 && (-1 < local_2ac))));
    poVar7 = std::operator<<((ostream *)&std::cout,"CMake is re-running because ");
    poVar7 = std::operator<<(poVar7,(string *)stampDepends.field_2._8_8_);
    poVar7 = std::operator<<(poVar7," is out-of-date.\n  the file \'");
    poVar7 = std::operator<<(poVar7,(string *)local_2a8);
    poVar7 = std::operator<<(poVar7,"\'\n  is newer than \'");
    poVar7 = std::operator<<(poVar7,(string *)local_38);
    poVar7 = std::operator<<(poVar7,"\'\n  result=\'");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_2ac);
    std::operator<<(poVar7,"\'\n");
    stampName_local._7_1_ = 0;
    bVar2 = true;
LAB_004ea2b0:
    std::__cxx11::string::~string((string *)local_2a8);
    cmFileTimeCache::~cmFileTimeCache((cmFileTimeCache *)((long)&dep.field_2 + 8));
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)(stampTemp.field_2._M_local_buf + 8));
      poVar7 = std::operator<<((ostream *)((long)&stampTemp.field_2 + 8),
                               (string *)stampDepends.field_2._8_8_);
      poVar7 = std::operator<<(poVar7,".tmp");
      uVar3 = cmSystemTools::RandomSeed();
      std::ostream::operator<<(poVar7,uVar3);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream((void *)((long)&err.field_2 + 8),pcVar5,_S_out);
      std::operator<<((ostream *)((long)&err.field_2 + 8),
                      "# CMake generation timestamp file for this directory.\n");
      std::ofstream::~ofstream((void *)((long)&err.field_2 + 8));
      std::__cxx11::string::string((string *)local_668);
      RVar4 = cmSystemTools::RenameFile
                        ((string *)&stamp.field_0x1f8,(string *)stampDepends.field_2._8_8_,Yes,
                         (string *)local_668);
      if (RVar4 != Success) {
        local_670 = cmsys::SystemTools::RemoveFile((string *)&stamp.field_0x1f8);
        cmStrCat<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string&>
                  (&local_690,(char (*) [27])"Cannot restore timestamp \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   stampDepends.field_2._8_8_,(char (*) [4])0x1056b77,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_668);
        cmSystemTools::Error(&local_690);
        std::__cxx11::string::~string((string *)&local_690);
      }
      stampName_local._7_1_ = RVar4 == Success;
      std::__cxx11::string::~string((string *)local_668);
      std::__cxx11::string::~string((string *)&stamp.field_0x1f8);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)(stampTemp.field_2._M_local_buf + 8));
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"CMake is re-running because ");
    poVar7 = std::operator<<(poVar7,(string *)stampDepends.field_2._8_8_);
    std::operator<<(poVar7," dependency file is missing.\n");
    stampName_local._7_1_ = 0;
  }
  std::ifstream::~ifstream(local_240);
  std::__cxx11::string::~string((string *)local_38);
  return (bool)(stampName_local._7_1_ & 1);
}

Assistant:

bool cmakeCheckStampFile(const std::string& stampName)
{
  // The stamp file does not exist.  Use the stamp dependencies to
  // determine whether it is really out of date.  This works in
  // conjunction with cmLocalVisualStudio7Generator to avoid
  // repeatedly re-running CMake when the user rebuilds the entire
  // solution.
  std::string stampDepends = cmStrCat(stampName, ".depend");
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(stampDepends.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(stampDepends.c_str());
#endif
  if (!fin) {
    // The stamp dependencies file cannot be read.  Just assume the
    // build system is really out of date.
    std::cout << "CMake is re-running because " << stampName
              << " dependency file is missing.\n";
    return false;
  }

  // Compare the stamp dependencies against the dependency file itself.
  {
    cmFileTimeCache ftc;
    std::string dep;
    while (cmSystemTools::GetLineFromStream(fin, dep)) {
      int result;
      if (!dep.empty() && dep[0] != '#' &&
          (!ftc.Compare(stampDepends, dep, &result) || result < 0)) {
        // The stamp depends file is older than this dependency.  The
        // build system is really out of date.
        /* clang-format off */
        std::cout << "CMake is re-running because " << stampName
                  << " is out-of-date.\n"
                     "  the file '" << dep << "'\n"
                     "  is newer than '" << stampDepends << "'\n"
                     "  result='" << result << "'\n";
        /* clang-format on */
        return false;
      }
    }
  }

  // The build system is up to date.  The stamp file has been removed
  // by the VS IDE due to a "rebuild" request.  Restore it atomically.
  std::ostringstream stampTempStream;
  stampTempStream << stampName << ".tmp" << cmSystemTools::RandomSeed();
  std::string stampTemp = stampTempStream.str();
  {
    // TODO: Teach cmGeneratedFileStream to use a random temp file (with
    // multiple tries in unlikely case of conflict) and use that here.
    cmsys::ofstream stamp(stampTemp.c_str());
    stamp << "# CMake generation timestamp file for this directory.\n";
  }
  std::string err;
  if (cmSystemTools::RenameFile(stampTemp, stampName,
                                cmSystemTools::Replace::Yes, &err) ==
      cmSystemTools::RenameResult::Success) {
    // CMake does not need to re-run because the stamp file is up-to-date.
    return true;
  }
  cmSystemTools::RemoveFile(stampTemp);
  cmSystemTools::Error(
    cmStrCat("Cannot restore timestamp \"", stampName, "\": ", err));
  return false;
}